

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_unix.cpp
# Opt level: O0

bool __thiscall
QEventDispatcherUNIX::processEvents(QEventDispatcherUNIX *this,ProcessEventsFlags flags)

{
  QDeadlineTimer deadline_00;
  bool bVar1;
  bool bVar2;
  byte bVar3;
  bool bVar4;
  QFlags<QEventLoop::ProcessEventsFlag> QVar5;
  int iVar6;
  QEventDispatcherUNIXPrivate *pQVar7;
  QEventDispatcherUNIXPrivate *this_00;
  QSocketNotifierSetUNIX *this_01;
  long in_FS_OFFSET;
  optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> oVar8;
  int nevents;
  bool canWait;
  bool wait_for_events;
  bool include_notifiers;
  bool include_timers;
  Type threadData;
  QEventDispatcherUNIXPrivate *d;
  const_iterator it;
  QDeadlineTimer deadline;
  optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> remaining;
  TimerType in_stack_fffffffffffffe88;
  ForeverConstant in_stack_fffffffffffffe8c;
  undefined2 in_stack_fffffffffffffe90;
  short in_stack_fffffffffffffe92;
  int in_stack_fffffffffffffe94;
  duration<long,_std::ratio<1L,_1000000000L>_> in_stack_fffffffffffffe98;
  pollfd *pfd;
  const_iterator *in_stack_fffffffffffffea0;
  QThreadPipe *this_02;
  QHash<int,_QSocketNotifierSetUNIX> *in_stack_fffffffffffffea8;
  QList<pollfd> *in_stack_fffffffffffffeb8;
  QTimerInfoList *in_stack_fffffffffffffec8;
  undefined1 *puVar9;
  undefined7 in_stack_fffffffffffffee8;
  byte bVar10;
  int local_110;
  qsizetype asize;
  QThreadData *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff0c;
  QObject *in_stack_ffffffffffffff10;
  bool local_a1;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 local_30 [17];
  CompareAgainstLiteralZero local_1f;
  CompareAgainstLiteralZero local_1e;
  CompareAgainstLiteralZero local_1d;
  undefined1 local_1c [4];
  _Storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true> local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = d_func((QEventDispatcherUNIX *)0x6b9e2d);
  QBasicAtomicInteger<int>::storeRelaxed
            ((QBasicAtomicInteger<int> *)
             CONCAT44(in_stack_fffffffffffffe94,
                      CONCAT22(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90)),
             in_stack_fffffffffffffe8c);
  QAbstractEventDispatcher::awake((QAbstractEventDispatcher *)0x6b9e59);
  QBasicAtomicPointer<QThreadData>::loadRelaxed((QBasicAtomicPointer<QThreadData> *)0x6b9e6a);
  QCoreApplicationPrivate::sendPostedEvents
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,in_stack_ffffffffffffff00);
  puVar9 = local_1c;
  QVar5 = QFlags<QEventLoop::ProcessEventsFlag>::operator&
                    ((QFlags<QEventLoop::ProcessEventsFlag> *)
                     CONCAT44(in_stack_fffffffffffffe94,
                              CONCAT22(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90)),
                     in_stack_fffffffffffffe8c);
  QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_1d,0);
  bVar1 = ::operator==(QVar5.super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
                       super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i);
  QVar5 = QFlags<QEventLoop::ProcessEventsFlag>::operator&
                    ((QFlags<QEventLoop::ProcessEventsFlag> *)
                     CONCAT44(in_stack_fffffffffffffe94,
                              CONCAT22(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90)),
                     in_stack_fffffffffffffe8c);
  QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_1e,0);
  bVar2 = ::operator==(QVar5.super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
                       super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i);
  QVar5 = QFlags<QEventLoop::ProcessEventsFlag>::operator&
                    ((QFlags<QEventLoop::ProcessEventsFlag> *)
                     CONCAT44(in_stack_fffffffffffffe94,
                              CONCAT22(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90)),
                     in_stack_fffffffffffffe8c);
  asize = 0;
  QtPrivate::CompareAgainstLiteralZero::CompareAgainstLiteralZero(&local_1f,0);
  bVar3 = ::operator!=(QVar5.super_QFlagsStorageHelper<QEventLoop::ProcessEventsFlag,_4>.
                       super_QFlagsStorage<QEventLoop::ProcessEventsFlag>.i);
  bVar4 = QThreadData::canWaitLocked((QThreadData *)in_stack_fffffffffffffe98.__r);
  bVar10 = 0;
  if (bVar4) {
    iVar6 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x6b9fcd);
    bVar10 = 0;
    if (iVar6 == 0) {
      bVar10 = bVar3;
    }
  }
  bVar3 = bVar10 & 1;
  if (bVar3 != 0) {
    QAbstractEventDispatcher::aboutToBlock((QAbstractEventDispatcher *)0x6ba000);
  }
  iVar6 = QBasicAtomicInteger<int>::loadRelaxed((QBasicAtomicInteger<int> *)0x6ba014);
  if (iVar6 == 0) {
    local_30._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_30._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QDeadlineTimer::QDeadlineTimer((QDeadlineTimer *)local_30);
    if (bVar3 != 0) {
      if (bVar1) {
        local_18 = (_Storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true>)
                   &DAT_aaaaaaaaaaaaaaaa;
        local_10 = &DAT_aaaaaaaaaaaaaaaa;
        oVar8 = QTimerInfoList::timerWait(in_stack_fffffffffffffec8);
        local_18 = oVar8.
                   super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   ._M_payload;
        local_10 = (undefined1 *)
                   CONCAT71(local_10._1_7_,
                            oVar8.
                            super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
                            ._M_payload.
                            super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            ._M_engaged);
        bVar4 = std::optional::operator_cast_to_bool
                          ((optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> *)
                           0x6ba0b8);
        if (bVar4) {
          std::optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>::operator*
                    ((optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> *)
                     0x6ba0cb);
          QDeadlineTimer::QDeadlineTimer<long,std::ratio<1l,1000000000l>>
                    ((QDeadlineTimer *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)
                     ,in_stack_fffffffffffffe98,PreciseTimer);
        }
        else {
          QDeadlineTimer::QDeadlineTimer
                    ((QDeadlineTimer *)
                     CONCAT44(in_stack_fffffffffffffe94,
                              CONCAT22(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90)),
                     in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88);
        }
        local_30._0_8_ = local_40;
        local_30._8_8_ = local_38;
      }
      else {
        QDeadlineTimer::QDeadlineTimer
                  ((QDeadlineTimer *)
                   CONCAT44(in_stack_fffffffffffffe94,
                            CONCAT22(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90)),
                   in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88);
        local_30._0_8_ = local_58;
        local_30._8_8_ = local_50;
      }
    }
    QList<pollfd>::clear
              ((QList<pollfd> *)
               CONCAT44(in_stack_fffffffffffffe94,
                        CONCAT22(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90)));
    if (bVar2) {
      this_00 = (QEventDispatcherUNIXPrivate *)
                QHash<int,_QSocketNotifierSetUNIX>::size(&pQVar7->socketNotifiers);
    }
    else {
      this_00 = (QEventDispatcherUNIXPrivate *)0x0;
    }
    QList<pollfd>::reserve(in_stack_fffffffffffffeb8,asize);
    if (bVar2) {
      QHash<int,_QSocketNotifierSetUNIX>::cbegin(in_stack_fffffffffffffea8);
      while( true ) {
        QHash<int,_QSocketNotifierSetUNIX>::cend
                  ((QHash<int,_QSocketNotifierSetUNIX> *)in_stack_fffffffffffffe98.__r);
        bVar4 = QHash<int,_QSocketNotifierSetUNIX>::const_iterator::operator!=
                          ((const_iterator *)in_stack_fffffffffffffe98.__r,
                           (const_iterator *)
                           CONCAT44(in_stack_fffffffffffffe94,
                                    CONCAT22(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90)));
        if (!bVar4) break;
        QHash<int,_QSocketNotifierSetUNIX>::const_iterator::key((const_iterator *)0x6ba277);
        this_01 = QHash<int,_QSocketNotifierSetUNIX>::const_iterator::value
                            ((const_iterator *)0x6ba28a);
        QSocketNotifierSetUNIX::events(this_01);
        qt_make_pollfd(in_stack_fffffffffffffe94,in_stack_fffffffffffffe92);
        QList<pollfd>::append
                  ((QList<pollfd> *)
                   CONCAT44(in_stack_fffffffffffffe94,
                            CONCAT22(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90)),
                   (rvalue_ref)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        QHash<int,_QSocketNotifierSetUNIX>::const_iterator::operator++(in_stack_fffffffffffffea0);
      }
    }
    this_02 = (QThreadPipe *)&pQVar7->pollfds;
    QThreadPipe::prepare
              ((QThreadPipe *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    QList<pollfd>::append
              ((QList<pollfd> *)
               CONCAT44(in_stack_fffffffffffffe94,
                        CONCAT22(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90)),
               (rvalue_ref)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    local_110 = 0;
    QList<pollfd>::data((QList<pollfd> *)
                        CONCAT44(in_stack_fffffffffffffe94,
                                 CONCAT22(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90)));
    QList<pollfd>::size(&pQVar7->pollfds);
    deadline_00._8_7_ = in_stack_fffffffffffffee8;
    deadline_00.t1 = (qint64)puVar9;
    deadline_00.type._3_1_ = bVar10;
    iVar6 = qt_safe_poll((pollfd *)this_02,in_stack_fffffffffffffe98.__r,deadline_00);
    if (iVar6 == -1) {
      qErrnoWarning("qt_safe_poll");
    }
    else if (iVar6 != 0) {
      pfd = (pollfd *)&(pQVar7->super_QAbstractEventDispatcherPrivate).field_0x94;
      QList<pollfd>::takeLast
                ((QList<pollfd> *)
                 CONCAT44(in_stack_fffffffffffffe94,
                          CONCAT22(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90)));
      local_110 = QThreadPipe::check(this_02,pfd);
      if (bVar2) {
        iVar6 = QEventDispatcherUNIXPrivate::activateSocketNotifiers(this_00);
        local_110 = iVar6 + local_110;
      }
    }
    if (bVar1) {
      iVar6 = QEventDispatcherUNIXPrivate::activateTimers((QEventDispatcherUNIXPrivate *)0x6ba414);
      local_110 = iVar6 + local_110;
    }
    local_a1 = 0 < local_110;
  }
  else {
    local_a1 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_a1;
}

Assistant:

bool QEventDispatcherUNIX::processEvents(QEventLoop::ProcessEventsFlags flags)
{
    Q_D(QEventDispatcherUNIX);
    d->interrupt.storeRelaxed(0);

    // we are awake, broadcast it
    emit awake();

    auto threadData = d->threadData.loadRelaxed();
    QCoreApplicationPrivate::sendPostedEvents(nullptr, 0, threadData);

    const bool include_timers = (flags & QEventLoop::X11ExcludeTimers) == 0;
    const bool include_notifiers = (flags & QEventLoop::ExcludeSocketNotifiers) == 0;
    const bool wait_for_events = (flags & QEventLoop::WaitForMoreEvents) != 0;

    const bool canWait = (threadData->canWaitLocked()
                          && !d->interrupt.loadRelaxed()
                          && wait_for_events);

    if (canWait)
        emit aboutToBlock();

    if (d->interrupt.loadRelaxed())
        return false;

    QDeadlineTimer deadline;
    if (canWait) {
        if (include_timers) {
            std::optional<nanoseconds> remaining = d->timerList.timerWait();
            deadline = remaining ? QDeadlineTimer{*remaining}
                             : QDeadlineTimer(QDeadlineTimer::Forever);
        } else {
            deadline = QDeadlineTimer(QDeadlineTimer::Forever);
        }
    } else {
        // Using the default-constructed `deadline`, which is already expired,
        // ensures the code in the do-while loop in qt_safe_poll runs at least once.
    }

    d->pollfds.clear();
    d->pollfds.reserve(1 + (include_notifiers ? d->socketNotifiers.size() : 0));

    if (include_notifiers)
        for (auto it = d->socketNotifiers.cbegin(); it != d->socketNotifiers.cend(); ++it)
            d->pollfds.append(qt_make_pollfd(it.key(), it.value().events()));

    // This must be last, as it's popped off the end below
    d->pollfds.append(d->threadPipe.prepare());

    int nevents = 0;
    switch (qt_safe_poll(d->pollfds.data(), d->pollfds.size(), deadline)) {
    case -1:
        qErrnoWarning("qt_safe_poll");
        if (QT_CONFIG(poll_exit_on_error))
            abort();
        break;
    case 0:
        break;
    default:
        nevents += d->threadPipe.check(d->pollfds.takeLast());
        if (include_notifiers)
            nevents += d->activateSocketNotifiers();
        break;
    }

    if (include_timers)
        nevents += d->activateTimers();

    // return true if we handled events, false otherwise
    return (nevents > 0);
}